

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O1

int get_coeff_cost_general
              (int is_last,int ci,tran_low_t abs_qc,int sign,int coeff_ctx,int dc_sign_ctx,
              LV_MAP_COEFF_COST *txb_costs,int bhl,TX_CLASS tx_class,uint8_t *levels)

{
  int iVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  uVar7 = 3;
  if (abs_qc < 3) {
    uVar7 = (ulong)(uint)abs_qc;
  }
  piVar2 = txb_costs->base_cost[coeff_ctx] + uVar7;
  if (is_last != 0) {
    piVar2 = txb_costs->base_eob_cost[coeff_ctx] + ((int)uVar7 - 1);
  }
  iVar1 = 0x200;
  if (ci == 0) {
    iVar1 = txb_costs->dc_sign_cost[dc_sign_ctx][(uint)sign];
  }
  if (abs_qc < 3) {
    return iVar1 + *piVar2;
  }
  bVar3 = (byte)bhl;
  iVar6 = ci >> (bVar3 & 0x1f);
  iVar8 = iVar6 << (bVar3 & 0x1f);
  if (is_last != 0) {
    if (ci == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 7;
      if (((1 < iVar6 || 1 < ci - iVar8) || tx_class != '\0') && (tx_class != '\x01' || iVar6 != 0))
      {
        uVar4 = 7;
        if (ci != iVar8) {
          uVar4 = 0xe;
        }
        if (tx_class != '\x02') {
          uVar4 = 0xe;
        }
      }
    }
    goto LAB_00245585;
  }
  iVar10 = 1 << (bVar3 & 0x1f);
  iVar12 = iVar10 + 4;
  iVar13 = iVar12 * iVar6 + (ci - iVar8);
  lVar11 = (long)(iVar10 + iVar13 + 4);
  uVar4 = (uint)levels[lVar11] + (uint)levels[(long)iVar13 + 1];
  if (tx_class == '\x02') {
    uVar9 = levels[(long)iVar13 + 2] + uVar4 + 1 >> 1;
    uVar4 = 6;
    if (uVar9 < 6) {
      uVar4 = uVar9;
    }
    if (ci == 0) goto LAB_00245585;
    if (ci == iVar8) {
LAB_00245582:
      uVar4 = uVar4 + 7;
      goto LAB_00245585;
    }
  }
  else if (tx_class == '\x01') {
    uVar9 = levels[iVar13 + iVar12 * 2] + uVar4 + 1 >> 1;
    uVar4 = 6;
    if (uVar9 < 6) {
      uVar4 = uVar9;
    }
    if (ci == 0) goto LAB_00245585;
    if (iVar6 == 0) goto LAB_00245582;
  }
  else if (tx_class == '\0') {
    uVar9 = levels[lVar11 + 1] + uVar4 + 1 >> 1;
    uVar4 = 6;
    if (uVar9 < 6) {
      uVar4 = uVar9;
    }
    if (ci == 0) goto LAB_00245585;
    if (iVar6 < 2 && ci - iVar8 < 2) goto LAB_00245582;
  }
  uVar4 = uVar4 + 0xe;
LAB_00245585:
  uVar9 = 0x1f;
  if (abs_qc - 0xeU != 0) {
    for (; abs_qc - 0xeU >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar7 = 0xf;
  if (abs_qc < 0xf) {
    uVar7 = (ulong)(uint)abs_qc;
  }
  uVar5 = 0;
  if (0xe < abs_qc) {
    uVar5 = (uVar9 ^ 0x1f) << 10 ^ 0x7e00;
  }
  return iVar1 + *piVar2 + uVar5 + txb_costs->lps_cost[(ulong)uVar4 - 1][uVar7 + 0x17];
}

Assistant:

static inline int get_coeff_cost_general(int is_last, int ci, tran_low_t abs_qc,
                                         int sign, int coeff_ctx,
                                         int dc_sign_ctx,
                                         const LV_MAP_COEFF_COST *txb_costs,
                                         int bhl, TX_CLASS tx_class,
                                         const uint8_t *levels) {
  int cost = 0;
  if (is_last) {
    cost += txb_costs->base_eob_cost[coeff_ctx][AOMMIN(abs_qc, 3) - 1];
  } else {
    cost += txb_costs->base_cost[coeff_ctx][AOMMIN(abs_qc, 3)];
  }
  if (abs_qc != 0) {
    if (ci == 0) {
      cost += txb_costs->dc_sign_cost[dc_sign_ctx][sign];
    } else {
      cost += av1_cost_literal(1);
    }
    if (abs_qc > NUM_BASE_LEVELS) {
      int br_ctx;
      if (is_last)
        br_ctx = get_br_ctx_eob(ci, bhl, tx_class);
      else
        br_ctx = get_br_ctx(levels, ci, bhl, tx_class);
      cost += get_br_cost(abs_qc, txb_costs->lps_cost[br_ctx]);
    }
  }
  return cost;
}